

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::MultAdd
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  *plVar1;
  double object;
  size_t sVar2;
  long lVar3;
  TPZDohrAssembleList<float> *this_00;
  TPZFMatrix<float> *local;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int isub;
  ulong uVar7;
  long lVar8;
  long lVar9;
  _List_node_base *p_Var10;
  long lVar11;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_> data;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_> v2work;
  TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_> v1threaddata;
  TPZSimpleTimer precondi;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_288;
  TPZAutoPointer<TPZDohrAssembly<float>_> local_280;
  _func_int **local_278;
  _func_int **local_270;
  _func_int **local_268;
  __native_type *local_260;
  TPZAutoPointer<TPZFMatrix<float>_> local_258;
  TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_> local_250;
  vector<std::thread,_std::allocator<std::thread>_> local_238;
  _List_node_base *local_220;
  __native_type local_218;
  _List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
  local_1f0;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_1d8 [2];
  TPZFMatrix<float> local_1c8;
  TPZFMatrix<float> local_138;
  undefined1 local_a8 [16];
  TPZFMatrix<float> *local_98;
  TPZSimpleTimer local_90;
  
  if (opt == 0) {
    lVar3 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    if (lVar3 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_0145886f;
LAB_0145887a:
    TPZMatrix<float>::Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  else {
    lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_0145886f:
    if ((this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow != lVar3) goto LAB_0145887a;
  }
  lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((((lVar3 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
       (lVar3 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol)) ||
      (lVar3 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow,
      lVar3 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) ||
     (lVar3 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<float>::Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZSimpleTimer::TPZSimpleTimer(&local_90);
  lVar3 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  lVar11 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  TPZMatrix<float>::PrepareZ(&this->super_TPZMatrix<float>,y,z,beta,opt);
  lVar5 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  local_138.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_138.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_268 = (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_138.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_138.fElem = (float *)0x0;
  local_138.fGiven = (float *)0x0;
  local_138.fSize = 0;
  local_138.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar3;
  local_138.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar5;
  TPZVec<int>::TPZVec(&local_138.fPivot.super_TPZVec<int>,0);
  local_138.fPivot.super_TPZVec<int>.fStore = local_138.fPivot.fExtAlloc;
  local_270 = (_func_int **)&PTR__TPZManVector_01815498;
  local_138.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_138.fPivot.super_TPZVec<int>.fNElements = 0;
  local_138.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_278 = (_func_int **)&PTR__TPZVec_01813d70;
  local_138.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_138.fWork.fStore = (float *)0x0;
  local_138.fWork.fNElements = 0;
  local_138.fWork.fNAlloc = 0;
  uVar7 = lVar5 * lVar3;
  if (uVar7 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (uVar7 < 0x4000000000000000) {
      uVar6 = uVar7 * 4;
    }
    local_138.fElem = (float *)operator_new__(uVar6);
    if (0 < (long)uVar7) {
      memset(local_138.fElem,0,uVar7 * 4);
    }
  }
  lVar5 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = local_268
  ;
  local_1c8.fElem = (float *)0x0;
  local_1c8.fGiven = (float *)0x0;
  local_1c8.fSize = 0;
  local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar11;
  local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar5;
  TPZVec<int>::TPZVec(&local_1c8.fPivot.super_TPZVec<int>,0);
  local_1c8.fPivot.super_TPZVec<int>.fStore = local_1c8.fPivot.fExtAlloc;
  local_1c8.fPivot.super_TPZVec<int>._vptr_TPZVec = local_270;
  local_1c8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1c8.fWork._vptr_TPZVec = local_278;
  local_1c8.fWork.fStore = (float *)0x0;
  local_1c8.fWork.fNElements = 0;
  local_1c8.fWork.fNAlloc = 0;
  uVar7 = lVar5 * lVar11;
  if (uVar7 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (uVar7 < 0x4000000000000000) {
      uVar6 = uVar7 * 4;
    }
    local_1c8.fElem = (float *)operator_new__(uVar6);
    if (0 < (long)uVar7) {
      memset(local_1c8.fElem,0,uVar7 * 4);
    }
  }
  if (0 < this->fNumThreads) {
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&local_238,(ulong)(uint)this->fNumThreads + 2,(allocator_type *)&local_218.__data);
    local_250.fSubStructure.fRef = (TPZReference *)local_a8;
    local_98 = &local_138;
    local_a8._0_8_ = this;
    local_a8._8_8_ = x;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<float,TPZDohrSubstructCondense<float>>*,void>
              ((thread *)&local_218.__data,
               TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_>::ComputeV1,
               (TPZDohrPrecondThreadV1Data<float,_TPZDohrSubstructCondense<float>_> **)&local_250);
    if (((local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start)->_M_id)._M_thread == 0) {
      ((local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start)->_M_id)._M_thread = local_218.__align;
      this_00 = (TPZDohrAssembleList<float> *)operator_new(0xe0);
      sVar2 = (this->fGlobal).
              super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              ._M_impl._M_node._M_size;
      local_280.fRef = (this->fAssemble).fRef;
      LOCK();
      ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_280.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZDohrAssembleList<float>::TPZDohrAssembleList(this_00,(int)sVar2,&local_1c8,&local_280);
      local_288.fRef = (TPZReference *)operator_new(0x10);
      plVar1 = &this->fGlobal;
      ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      (local_288.fRef)->fPointer = this_00;
      LOCK();
      ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer(&local_280);
      local_1f0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1f0;
      isub = 0;
      local_218.__data.__list.__next = (__pthread_internal_list *)0x0;
      local_218._16_8_ = 0;
      local_218.__data.__list.__prev = (__pthread_internal_list *)0x0;
      local_218.__align = 0;
      local_218._8_8_ = 0;
      local_1f0._M_impl._M_node._M_size = 0;
      local_1d8[0].fRef = local_288.fRef;
      LOCK();
      ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_288.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      p_Var10 = (plVar1->
                super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      local_220 = (_List_node_base *)plVar1;
      local_1f0._M_impl._M_node.super__List_node_base._M_prev =
           local_1f0._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var10 != (_List_node_base *)plVar1) {
        do {
          local = (TPZFMatrix<float> *)operator_new(0x90);
          (local->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
          (local->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = 0;
          (local->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
          (local->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
          (local->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_268;
          local->fElem = (float *)0x0;
          local->fGiven = (float *)0x0;
          local->fSize = 0;
          TPZVec<int>::TPZVec(&(local->fPivot).super_TPZVec<int>,0);
          (local->fPivot).super_TPZVec<int>._vptr_TPZVec = local_270;
          (local->fPivot).super_TPZVec<int>.fStore = (local->fPivot).fExtAlloc;
          (local->fPivot).super_TPZVec<int>.fNElements = 0;
          (local->fPivot).super_TPZVec<int>.fNAlloc = 0;
          (local->fWork)._vptr_TPZVec = local_278;
          (local->fWork).fStore = (float *)0x0;
          (local->fWork).fNElements = 0;
          (local->fWork).fNAlloc = 0;
          TPZDohrAssembly<float>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,local);
          local_258.fRef = (TPZReference *)operator_new(0x10);
          ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
          (local_258.fRef)->fPointer = local;
          LOCK();
          ((local_258.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
          UNLOCK();
          TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>::TPZDohrPrecondV2SubData
                    (&local_250,isub,
                     (TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)(p_Var10 + 1),&local_258);
          TPZAutoPointer<TPZFMatrix<float>_>::~TPZAutoPointer(&local_258);
          TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_>::AddItem
                    ((TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_> *)
                     &local_218.__data,&local_250);
          TPZAutoPointer<TPZDohrAssembleItem<float>_>::~TPZAutoPointer(&local_250.fv2_local);
          TPZAutoPointer<TPZFMatrix<float>_>::~TPZAutoPointer(&local_250.fInput_local);
          TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer
                    (&local_250.fSubStructure);
          isub = isub + 1;
          p_Var10 = p_Var10->_M_next;
        } while (p_Var10 != local_220);
      }
      if (0 < this->fNumThreads) {
        lVar11 = 0;
        do {
          local_260 = &local_218;
          std::thread::
          thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<float,TPZDohrSubstructCondense<float>>*,void>
                    ((thread *)&local_250,
                     TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_>::
                     ThreadWork,
                     (TPZDohrPrecondV2SubDataList<float,_TPZDohrSubstructCondense<float>_> **)
                     &local_260);
          if (local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11 + 2]._M_id._M_thread != 0) goto LAB_01458f39;
          local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11 + 2]._M_id._M_thread =
               (native_handle_type)local_250.fSubStructure.fRef;
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->fNumThreads);
      }
      local_260 = (__native_type *)(local_288.fRef)->fPointer;
      std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
                ((thread *)&local_250,TPZDohrAssembleList<float>::Assemble,
                 (TPZDohrAssembleList<float> **)&local_260);
      if (local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[1]._M_id._M_thread == 0) {
        local_238.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start[1]._M_id._M_thread =
             (native_handle_type)local_250.fSubStructure.fRef;
        if (-2 < this->fNumThreads) {
          lVar11 = -1;
          do {
            std::thread::join();
            lVar11 = lVar11 + 1;
          } while (lVar11 <= this->fNumThreads);
        }
        TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer(local_1d8);
        std::__cxx11::
        _List_base<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>,_std::allocator<TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>_>_>
        ::_M_clear(&local_1f0);
        TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer(&local_288);
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_238);
        goto LAB_01458ddc;
      }
    }
LAB_01458f39:
    std::terminate();
  }
  ComputeV1(this,x,&local_138);
  ComputeV2(this,x,&local_1c8);
LAB_01458ddc:
  TPZFMatrix<float>::operator+=(&local_1c8,&local_138.super_TPZMatrix<float>);
  lVar11 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if (0 < lVar11) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      if (0 < lVar3) {
        lVar9 = 0;
        do {
          if ((local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar9) ||
             (local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
          if ((lVar4 <= lVar9) || ((z->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = lVar4 * lVar5;
          *(float *)((long)z->fElem + lVar9 * 4 + lVar4) =
               *(float *)((long)local_1c8.fElem +
                         lVar9 * 4 +
                         local_1c8.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar5) +
               *(float *)((long)z->fElem + lVar9 * 4 + lVar4);
          lVar9 = lVar9 + 1;
        } while (lVar3 != lVar9);
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 4;
    } while (lVar8 != lVar11);
  }
  object = TPZSimpleTimer::ReturnTimeDouble(&local_90);
  TPZStack<double,_10>::Push(&tempo.fPreCond,object);
  TPZFMatrix<float>::~TPZFMatrix(&local_1c8);
  TPZFMatrix<float>::~TPZFMatrix(&local_138);
  TPZSimpleTimer::~TPZSimpleTimer(&local_90);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}